

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1_enc.cc
# Opt level: O0

bool bssl::tls1_generate_master_secret
               (SSL_HANDSHAKE *hs,Span<unsigned_char> out,Span<const_unsigned_char> premaster)

{
  SSL *pSVar1;
  string_view label;
  string_view label_00;
  Span<const_unsigned_char> seed1;
  Span<const_unsigned_char> seed1_00;
  Span<const_unsigned_char> seed2;
  Span<const_unsigned_char> seed2_00;
  Span<const_unsigned_char> secret;
  Span<unsigned_char> out_00;
  Span<const_unsigned_char> secret_00;
  Span<unsigned_char> out_01;
  bool bVar2;
  size_t sVar3;
  EVP_MD *pEVar4;
  byte local_141;
  uchar *local_140;
  size_t local_138;
  uchar *local_130;
  size_t local_128;
  basic_string_view<char,_std::char_traits<char>_> local_120;
  uchar *local_110;
  uchar *local_108;
  uchar *local_100;
  size_t local_f8;
  Span<const_unsigned_char> local_f0;
  Span<unsigned_char> local_e0;
  uchar *local_d0;
  size_t local_c8;
  basic_string_view<char,_std::char_traits<char>_> local_c0;
  uchar *local_b0;
  uchar *local_a8;
  uchar *local_a0;
  size_t local_98;
  size_t local_90;
  size_t digests_len;
  uint8_t digests [64];
  SSL *ssl;
  SSL_HANDSHAKE *hs_local;
  Span<const_unsigned_char> premaster_local;
  Span<unsigned_char> out_local;
  
  premaster_local.data_ = (uchar *)premaster.size_;
  premaster_local.size_ = (size_t)out.data_;
  sVar3 = Span<unsigned_char>::size((Span<unsigned_char> *)&premaster_local.size_);
  if (sVar3 != 0x30) {
    abort();
  }
  pSVar1 = hs->ssl;
  if ((*(uint *)&hs->field_0x6c8 >> 0x11 & 1) == 0) {
    pEVar4 = SSLTranscript::Digest(&hs->transcript);
    local_100 = (uchar *)premaster_local.size_;
    local_108 = premaster_local.data_;
    local_110 = premaster.data_;
    local_f8 = out.size_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_120,"master secret");
    Span<unsigned_char_const>::Span<32ul>
              ((Span<unsigned_char_const> *)&local_130,&pSVar1->s3->client_random);
    Span<unsigned_char_const>::Span<32ul>
              ((Span<unsigned_char_const> *)&local_140,&pSVar1->s3->server_random);
    out_00.size_ = local_f8;
    out_00.data_ = local_100;
    secret.size_ = (size_t)local_108;
    secret.data_ = local_110;
    label_00._M_str = local_120._M_str;
    label_00._M_len = local_120._M_len;
    seed1_00.size_ = local_128;
    seed1_00.data_ = local_130;
    seed2_00.size_ = local_138;
    seed2_00.data_ = local_140;
    bVar2 = tls1_prf(pEVar4,out_00,secret,label_00,seed1_00,seed2_00);
    if (!bVar2) {
      return false;
    }
  }
  else {
    bVar2 = SSLTranscript::GetHash(&hs->transcript,(uint8_t *)&digests_len,&local_90);
    local_141 = 1;
    if (bVar2) {
      pEVar4 = SSLTranscript::Digest(&hs->transcript);
      local_a0 = (uchar *)premaster_local.size_;
      local_a8 = premaster_local.data_;
      local_b0 = premaster.data_;
      local_98 = out.size_;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_c0,"extended master secret");
      Span<unsigned_char>::Span(&local_e0,(uchar *)&digests_len,local_90);
      Span<unsigned_char_const>::Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
                ((Span<unsigned_char_const> *)&local_d0,&local_e0);
      Span<const_unsigned_char>::Span(&local_f0);
      out_01.size_ = local_98;
      out_01.data_ = local_a0;
      secret_00.size_ = (size_t)local_a8;
      secret_00.data_ = local_b0;
      label._M_str = local_c0._M_str;
      label._M_len = local_c0._M_len;
      seed1.size_ = local_c8;
      seed1.data_ = local_d0;
      seed2.size_ = local_f0.size_;
      seed2.data_ = local_f0.data_;
      bVar2 = tls1_prf(pEVar4,out_01,secret_00,label,seed1,seed2);
      local_141 = bVar2 ^ 0xff;
    }
    if ((local_141 & 1) != 0) {
      return false;
    }
  }
  return true;
}

Assistant:

bool tls1_generate_master_secret(SSL_HANDSHAKE *hs, Span<uint8_t> out,
                                 Span<const uint8_t> premaster) {
  BSSL_CHECK(out.size() == SSL3_MASTER_SECRET_SIZE);

  const SSL *ssl = hs->ssl;
  if (hs->extended_master_secret) {
    uint8_t digests[EVP_MAX_MD_SIZE];
    size_t digests_len;
    if (!hs->transcript.GetHash(digests, &digests_len) ||
        !tls1_prf(hs->transcript.Digest(), out, premaster,
                  "extended master secret", Span(digests, digests_len), {})) {
      return false;
    }
  } else {
    if (!tls1_prf(hs->transcript.Digest(), out, premaster, "master secret",
                  ssl->s3->client_random, ssl->s3->server_random)) {
      return false;
    }
  }

  return true;
}